

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall
soplex::LPColSetBase<double>::add
          (LPColSetBase<double> *this,DataKey *newkey,double *obj,double *newlower,
          SVectorBase<double> *newcolVector,double *newupper,int *newscaleExp)

{
  int iVar1;
  int iVar2;
  VectorBase<double> *this_00;
  double *pdVar3;
  DataArray<int> *this_01;
  int *piVar4;
  double *in_RCX;
  double *in_RDX;
  long in_RDI;
  double *in_R9;
  int *in_stack_00000008;
  int in_stack_ffffffffffffff5c;
  DataArray<int> *in_stack_ffffffffffffff60;
  SVectorBase<double> *in_stack_ffffffffffffff70;
  DataKey *in_stack_ffffffffffffff78;
  double dVar5;
  SVSetBase<double> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  VectorBase<double> *in_stack_ffffffffffffff90;
  
  SVSetBase<double>::add
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  iVar1 = num((LPColSetBase<double> *)0x26bf78);
  iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x26bf8a);
  if (iVar2 < iVar1) {
    num((LPColSetBase<double> *)0x26bfae);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPColSetBase<double> *)0x26bfd7);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPColSetBase<double> *)0x26c000);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
    num((LPColSetBase<double> *)0x26c029);
    DataArray<int>::reSize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  dVar5 = *in_RCX;
  this_00 = (VectorBase<double> *)(in_RDI + 0x68);
  num((LPColSetBase<double> *)0x26c05d);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar5;
  dVar5 = *in_R9;
  num((LPColSetBase<double> *)0x26c09d);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar5;
  dVar5 = *in_RDX;
  num((LPColSetBase<double> *)0x26c0e0);
  pdVar3 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff5c);
  *pdVar3 = dVar5;
  iVar1 = *in_stack_00000008;
  this_01 = (DataArray<int> *)(in_RDI + 0xb0);
  iVar2 = num((LPColSetBase<double> *)0x26c11f);
  piVar4 = DataArray<int>::operator[](this_01,iVar2 + -1);
  *piVar4 = iVar1;
  return;
}

Assistant:

void add(DataKey& newkey, const R& obj, const R& newlower, const SVectorBase<R>& newcolVector,
            const R& newupper, const int& newscaleExp = 0)
   {
      SVSetBase<R>::add(newkey, newcolVector);

      if(num() > low.dim())
      {
         low.reDim(num());
         up.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      low[num() - 1] = newlower;
      up[num() - 1] = newupper;
      object[num() - 1] = obj;
      scaleExp[num() - 1] = newscaleExp;
   }